

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

void __thiscall
pybind11::detail::type_caster_generic::load_value(type_caster_generic *this,value_and_holder *v_h)

{
  void **ppvVar1;
  type_info *ptVar2;
  void *pvVar3;
  
  ppvVar1 = v_h->vh;
  pvVar3 = *ppvVar1;
  if (pvVar3 == (void *)0x0) {
    ptVar2 = v_h->type;
    if (ptVar2 == (type_info *)0x0) {
      ptVar2 = this->typeinfo;
    }
    if (ptVar2->operator_new == (_func_void_ptr_size_t *)0x0) {
      pvVar3 = operator_new(ptVar2->type_size);
    }
    else {
      pvVar3 = (*ptVar2->operator_new)(ptVar2->type_size);
    }
    *ppvVar1 = pvVar3;
  }
  this->value = pvVar3;
  return;
}

Assistant:

void load_value(value_and_holder &&v_h) {
        auto *&vptr = v_h.value_ptr();
        // Lazy allocation for unallocated values:
        if (vptr == nullptr) {
            auto *type = v_h.type ? v_h.type : typeinfo;
            if (type->operator_new) {
                vptr = type->operator_new(type->type_size);
            } else {
                #if defined(__cpp_aligned_new) && (!defined(_MSC_VER) || _MSC_VER >= 1912)
                    if (type->type_align > __STDCPP_DEFAULT_NEW_ALIGNMENT__)
                        vptr = ::operator new(type->type_size,
                                              std::align_val_t(type->type_align));
                    else
                #endif
                vptr = ::operator new(type->type_size);
            }
        }
        value = vptr;
    }